

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# if_conversion.cpp
# Opt level: O2

bool __thiscall
spvtools::opt::IfConversion::CheckBlock
          (IfConversion *this,BasicBlock *block,DominatorAnalysis *dominators,BasicBlock **common)

{
  uint32_t *puVar1;
  bool bVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  CFG *pCVar5;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar6;
  BasicBlock *pBVar7;
  BasicBlock *b;
  Instruction *pIVar8;
  
  pCVar5 = Pass::cfg(&this->super_Pass);
  uVar3 = BasicBlock::id(block);
  pvVar6 = CFG::preds(pCVar5,uVar3);
  puVar1 = (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 8) {
    pBVar7 = IRContext::get_instr_block((this->super_Pass).context_,*puVar1);
    bVar2 = DominatorAnalysisBase::Dominates(&dominators->super_DominatorAnalysisBase,block,pBVar7);
    if (!bVar2) {
      b = IRContext::get_instr_block
                    ((this->super_Pass).context_,
                     (pvVar6->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                     _M_impl.super__Vector_impl_data._M_start[1]);
      bVar2 = DominatorAnalysisBase::Dominates(&dominators->super_DominatorAnalysisBase,block,b);
      if (pBVar7 != b && !bVar2) {
        pBVar7 = DominatorAnalysisBase::CommonDominator
                           (&dominators->super_DominatorAnalysisBase,pBVar7,b);
        *common = pBVar7;
        if (pBVar7 != (BasicBlock *)0x0) {
          pCVar5 = Pass::cfg(&this->super_Pass);
          if ((((&pCVar5->pseudo_entry_block_ != *common) &&
               (pIVar8 = BasicBlock::terminator(*common), pIVar8->opcode_ == OpBranchConditional))
              && (pIVar8 = BasicBlock::GetMergeInst(*common), pIVar8 != (Instruction *)0x0)) &&
             ((pIVar8->opcode_ == OpSelectionMerge &&
              (uVar3 = Instruction::GetSingleWordInOperand(pIVar8,1), uVar3 != 2)))) {
            uVar3 = BasicBlock::MergeBlockIdIfAny(*common);
            uVar4 = BasicBlock::id(block);
            return uVar3 == uVar4;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool IfConversion::CheckBlock(BasicBlock* block, DominatorAnalysis* dominators,
                              BasicBlock** common) {
  const std::vector<uint32_t>& preds = cfg()->preds(block->id());

  // TODO(alan-baker): Extend to more than two predecessors
  if (preds.size() != 2) return false;

  BasicBlock* inc0 = context()->get_instr_block(preds[0]);
  if (dominators->Dominates(block, inc0)) return false;

  BasicBlock* inc1 = context()->get_instr_block(preds[1]);
  if (dominators->Dominates(block, inc1)) return false;

  if (inc0 == inc1) {
    // If the predecessor blocks are the same, then there is only 1 value for
    // the OpPhi.  Other transformation should be able to simplify that.
    return false;
  }
  // All phis will have the same common dominator, so cache the result
  // for this block. If there is no common dominator, then we cannot transform
  // any phi in this basic block.
  *common = dominators->CommonDominator(inc0, inc1);
  if (!*common || cfg()->IsPseudoEntryBlock(*common)) return false;
  Instruction* branch = (*common)->terminator();
  if (branch->opcode() != spv::Op::OpBranchConditional) return false;
  auto merge = (*common)->GetMergeInst();
  if (!merge || merge->opcode() != spv::Op::OpSelectionMerge) return false;
  if (spv::SelectionControlMask(merge->GetSingleWordInOperand(1)) ==
      spv::SelectionControlMask::DontFlatten) {
    return false;
  }
  if ((*common)->MergeBlockIdIfAny() != block->id()) return false;

  return true;
}